

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O0

void Assimp::FBX::Util::DOMWarning(string *message,Element *element)

{
  Token *token;
  Logger *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Element *local_18;
  Element *element_local;
  string *message_local;
  
  local_18 = element;
  element_local = (Element *)message;
  if (element == (Element *)0x0) {
    pLVar1 = DefaultLogger::get();
    if (pLVar1 != (Logger *)0x0) {
      pLVar1 = DefaultLogger::get();
      std::operator+(&local_38,"FBX-DOM: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     element_local);
      Logger::warn(pLVar1,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    token = Element::KeyToken(element);
    DOMWarning(message,token);
  }
  return;
}

Assistant:

void DOMWarning(const std::string& message, const Element* element /*= NULL*/)
{
    if(element) {
        DOMWarning(message,element->KeyToken());
        return;
    }
    if(DefaultLogger::get()) {
        ASSIMP_LOG_WARN("FBX-DOM: " + message);
    }
}